

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

bool __thiscall
presolve::HighsPostsolveStack::duplicateColumn
          (HighsPostsolveStack *this,double colScale,double colLower,double colUpper,
          double duplicateColLower,double duplicateColUpper,HighsInt col,HighsInt duplicateCol,
          bool colIntegral,bool duplicateColIntegral,double ok_merge_tolerance)

{
  pointer piVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  size_t position;
  DuplicateColumn debug_values;
  ReductionType local_69;
  unsigned_long local_68;
  DuplicateColumn local_60;
  
  piVar1 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60.col = piVar1[col];
  lVar6 = (long)local_60.col;
  local_60.duplicateCol = piVar1[duplicateCol];
  lVar7 = (long)local_60.duplicateCol;
  local_60.colScale = colScale;
  local_60.colLower = colLower;
  local_60.colUpper = colUpper;
  local_60.duplicateColLower = duplicateColLower;
  local_60.duplicateColUpper = duplicateColUpper;
  local_60.colIntegral = colIntegral;
  local_60.duplicateColIntegral = duplicateColIntegral;
  bVar5 = DuplicateColumn::okMerge(&local_60,ok_merge_tolerance);
  if (bVar5) {
    pcVar2 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar3 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (&(this->reductionValues).data,(size_type)(pcVar2 + (0x38 - (long)pcVar3)));
    pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(ulong *)(pcVar2 + (long)(pcVar4 + (0x30 - (long)pcVar3))) =
         CONCAT62(local_60._50_6_,CONCAT11(local_60.duplicateColIntegral,local_60.colIntegral));
    *(double *)(pcVar2 + (long)(pcVar4 + (0x20 - (long)pcVar3))) = local_60.duplicateColUpper;
    *(ulong *)((long)(pcVar2 + (long)(pcVar4 + (0x20 - (long)pcVar3))) + 8) =
         CONCAT44(local_60.duplicateCol,local_60.col);
    *(double *)(pcVar2 + (long)(pcVar4 + (0x10 - (long)pcVar3))) = local_60.colUpper;
    *(double *)((long)(pcVar2 + (long)(pcVar4 + (0x10 - (long)pcVar3))) + 8) =
         local_60.duplicateColLower;
    *(double *)(pcVar2 + ((long)pcVar4 - (long)pcVar3)) = local_60.colScale;
    *(double *)((long)(pcVar2 + ((long)pcVar4 - (long)pcVar3)) + 8) = local_60.colLower;
    local_69 = kDuplicateColumn;
    local_68 = (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
    ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
              ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
                *)&this->reductions,&local_69,&local_68);
    (this->linearlyTransformable).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar6] = '\0';
    (this->linearlyTransformable).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar7] = '\0';
  }
  return bVar5;
}

Assistant:

bool duplicateColumn(double colScale, double colLower, double colUpper,
                       double duplicateColLower, double duplicateColUpper,
                       HighsInt col, HighsInt duplicateCol, bool colIntegral,
                       bool duplicateColIntegral,
                       const double ok_merge_tolerance) {
    const HighsInt origCol = origColIndex[col];
    const HighsInt origDuplicateCol = origColIndex[duplicateCol];
    DuplicateColumn debug_values = {
        colScale,          colLower,          colUpper,
        duplicateColLower, duplicateColUpper, origCol,
        origDuplicateCol,  colIntegral,       duplicateColIntegral};
    const bool ok_merge = debug_values.okMerge(ok_merge_tolerance);
    const bool prevent_illegal_merge = true;
    if (!ok_merge && prevent_illegal_merge) return false;
    reductionValues.push(debug_values);
    //    reductionValues.push(DuplicateColumn{
    //        colScale, colLower, colUpper, duplicateColLower,
    //        duplicateColUpper, origCol, origDuplicateCol, colIntegral,
    //        duplicateColIntegral});

    reductionAdded(ReductionType::kDuplicateColumn);

    // mark columns as not linearly transformable
    linearlyTransformable[origCol] = false;
    linearlyTransformable[origDuplicateCol] = false;
    return true;
  }